

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedCharException::MismatchedCharException
          (MismatchedCharException *this,int c,BitSet *set_,bool matchNot,CharScanner *scanner_)

{
  undefined4 uVar1;
  undefined4 uVar2;
  BitSet *this_00;
  byte in_CL;
  undefined8 in_RDX;
  undefined4 in_ESI;
  string *in_RDI;
  long *in_R8;
  string *s;
  RecognitionException *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  s = (string *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  this_00 = (BitSet *)(**(code **)(*in_R8 + 0xd0))();
  uVar1 = (**(code **)(*in_R8 + 0xb0))();
  uVar2 = (**(code **)(*in_R8 + 0xc0))();
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffffa0,s,in_RDI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  *(undefined ***)in_RDI = &PTR__MismatchedCharException_00469148;
  *(uint *)&in_RDI[2].field_2 = (in_CL & 1) + 5;
  *(undefined4 *)((long)&in_RDI[2].field_2 + 4) = in_ESI;
  BitSet::BitSet(this_00,(BitSet *)CONCAT44(uVar1,uVar2));
  in_RDI[4]._M_string_length = (size_type)in_R8;
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException(
	int c,
	BitSet set_,
	bool matchNot,
	CharScanner* scanner_
) : RecognitionException("Mismatched char",
                         scanner_->getFilename(),
								 scanner_->getLine(), scanner_->getColumn())
  , mismatchType(matchNot ? NOT_SET : SET)
  , foundChar(c)
  , set(set_)
  , scanner(scanner_)
{
}